

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_DOT_zzx(DisasContext_conflict1 *s,arg_DOT_zzx *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t oprsz;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  arg_DOT_zzx *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    oprsz = vec_full_reg_size(s);
    dofs = vec_full_reg_offset(s,a->rd);
    aofs = vec_full_reg_offset(s,a->rn);
    bofs = vec_full_reg_offset(s,a->rm);
    tcg_gen_gvec_3_ool_aarch64
              (tcg_ctx_00,dofs,aofs,bofs,oprsz,oprsz,a->index,
               (gen_helper_gvec_3_conflict1 *)trans_DOT_zzx::fns[a->u][a->sz]);
  }
  return true;
}

Assistant:

static bool trans_DOT_zzx(DisasContext *s, arg_DOT_zzx *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    static gen_helper_gvec_3 * const fns[2][2] = {
        { gen_helper_gvec_sdot_idx_b, gen_helper_gvec_sdot_idx_h },
        { gen_helper_gvec_udot_idx_b, gen_helper_gvec_udot_idx_h }
    };

    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        tcg_gen_gvec_3_ool(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           vec_full_reg_offset(s, a->rm),
                           vsz, vsz, a->index, fns[a->u][a->sz]);
    }
    return true;
}